

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageView::mouseMoveEvent(PageView *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  int iVar3;
  int delta;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (((this->d).d)->leftButtonPressed == true) {
    dVar4 = (double)QEventPoint::position();
    iVar3 = (int)((double)((ulong)dVar4 & 0x8000000000000000 | (ulong)DAT_001817e0) + dVar4);
    iVar1 = (((this->d).d)->pos).xp;
    auVar5 = QEventPoint::position();
    QVar2.xp = (int)((double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar5._0_8_);
    QVar2.yp = (int)((double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar5._8_8_);
    ((this->d).d)->pos = QVar2;
    delta = iVar3 - iVar1;
    if (delta == 0 || iVar3 < iVar1) {
      if (delta < 0) {
        PageViewPrivate::movePageLeft((this->d).d,-delta);
      }
    }
    else {
      PageViewPrivate::movePageRight((this->d).d,delta);
    }
  }
  e[0xc] = (QMouseEvent)0x0;
  return;
}

Assistant:

void
PageView::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftButtonPressed )
	{
		const int delta = ( e->pos() - d->pos ).x();

		d->pos = e->pos();

		if( delta > 0 )
			d->movePageRight( delta );
		else if( delta < 0 )
			d->movePageLeft( qAbs( delta ) );
	}

	e->ignore();
}